

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.hpp
# Opt level: O2

void __thiscall
Apple::II::Video::
Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true>::VideoBusHandler,_true>
::advance(Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true>::VideoBusHandler,_true>
          *this,Cycles cycles)

{
  CRT *this_00;
  int iVar1;
  VideoBusHandler *pVVar2;
  GraphicsMode GVar3;
  int iVar4;
  uint8_t *puVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  
  this_00 = &(this->super_VideoBase).crt_;
  do {
    iVar10 = SUB84(cycles.super_WrappedInt<Cycles>.length_,0);
    if (iVar10 == 0) {
      return;
    }
    iVar4 = (this->super_VideoBase).column_;
    iVar15 = 0x41 - iVar4;
    if (iVar10 < 0x41 - iVar4) {
      iVar15 = iVar10;
    }
    iVar7 = (this->super_VideoBase).row_;
    iVar1 = iVar4 + iVar15;
    uVar6 = iVar7 - 0xdc;
    if (uVar6 < 3) {
      iVar7 = 0x2d;
      if (0x2d < iVar4) {
        iVar7 = iVar4;
      }
      iVar8 = 0x31;
      if (iVar1 < 0x31) {
        iVar8 = iVar1;
      }
      if (iVar8 - iVar7 == 0 || iVar8 < iVar7) {
        Outputs::CRT::CRT::output_sync(this_00,iVar15 * 0xe);
      }
      else {
        if (iVar4 < 0x2d) {
          Outputs::CRT::CRT::output_sync(this_00,(iVar7 - iVar4) * 0xe);
        }
        Outputs::CRT::CRT::output_blank(this_00,(iVar8 - iVar7) * 0xe);
        if (0x31 < iVar1) {
          Outputs::CRT::CRT::output_sync(this_00,(iVar1 - iVar8) * 0xe);
        }
      }
    }
    else {
      GVar3 = VideoSwitches<Cycles>::graphics_mode((VideoSwitches<Cycles> *)this,iVar7);
      uVar16 = (this->super_VideoBase).row_;
      iVar4 = (this->super_VideoBase).column_;
      if (iVar4 < 0x28 && (int)uVar16 < 0xc0) {
        uVar12 = (uVar16 & 0x38) * 0x10 + (uVar16 >> 6) * 0x28;
        iVar7 = 0x28;
        if (iVar1 < 0x28) {
          iVar7 = iVar1;
        }
        bVar9 = (this->super_VideoBase).super_VideoSwitches<Cycles>.internal_.store_80;
        uVar11 = (uint)(this->super_VideoBase).super_VideoSwitches<Cycles>.internal_.page2;
        if ((GVar3 & ~DoubleText) == HighRes) {
          iVar8 = uVar11 * 0x2000 + 0x2000;
          if (bVar9 != false) {
            iVar8 = 0x2000;
          }
          iVar8 = (uVar16 & 7) * 0x400 + iVar8 + (uVar12 & 0xfff8);
        }
        else {
          iVar8 = uVar11 * 0x400 + 0x400;
          if (bVar9 != false) {
            iVar8 = 0x400;
          }
          iVar8 = iVar8 + uVar12;
        }
        pVVar2 = this->bus_handler_;
        uVar16 = iVar8 + iVar4 & 0xffff;
        memcpy((this->super_VideoBase).base_stream_._M_elems + iVar4,pVVar2->ram_ + uVar16,
               (long)(iVar7 - iVar4));
        memcpy((this->super_VideoBase).auxiliary_stream_._M_elems + iVar4,pVVar2->aux_ram_ + uVar16,
               (long)(iVar7 - iVar4));
        uVar16 = (this->super_VideoBase).row_;
      }
      uVar12 = (this->super_VideoBase).column_;
      if ((int)uVar16 < 0xc0) {
        if (uVar12 == 0) {
          puVar5 = Outputs::CRT::CRT::begin_data(this_00,0x238,1);
          (this->super_VideoBase).pixel_pointer_ = puVar5;
          (this->super_VideoBase).graphics_carry_ = '\0';
          (this->super_VideoBase).was_double_ = true;
          uVar12 = (this->super_VideoBase).column_;
        }
        if ((int)uVar12 < 0x28) {
          if ((int)uVar12 < 1) {
            uVar12 = 0;
          }
          iVar4 = 0x28;
          if (iVar1 < 0x28) {
            iVar4 = iVar1;
          }
          uVar16 = (this->super_VideoBase).row_;
          uVar14 = (ulong)uVar12;
          bVar9 = (bool)((byte)GVar3 & 1);
          if (((GVar3 & DoubleText) == Text) && ((this->super_VideoBase).was_double_ == true)) {
            puVar5 = (this->super_VideoBase).pixel_pointer_;
            if (puVar5 != (uint8_t *)0x0) {
              uVar13 = uVar14 * 0xe;
              puVar5[uVar13 + 6] = '\0';
              (this->super_VideoBase).pixel_pointer_[uVar13 + 5] = '\0';
              (this->super_VideoBase).pixel_pointer_[uVar13 + 4] = '\0';
              (this->super_VideoBase).pixel_pointer_[uVar13 + 3] = '\0';
              (this->super_VideoBase).pixel_pointer_[uVar13 + 2] = '\0';
              (this->super_VideoBase).pixel_pointer_[(uVar13 & 0xffffffff) + 1] = '\0';
              (this->super_VideoBase).pixel_pointer_[uVar13] = '\0';
              goto LAB_0025debb;
            }
            (this->super_VideoBase).was_double_ = bVar9;
          }
          else {
LAB_0025debb:
            puVar5 = (this->super_VideoBase).pixel_pointer_;
            (this->super_VideoBase).was_double_ = bVar9;
            if ((puVar5 != (uint8_t *)0x0) && (GVar3 < (FatLowRes|DoubleText))) {
              uVar16 = uVar16 & 7;
              switch(GVar3) {
              case Text:
                VideoBase::output_text
                          (&this->super_VideoBase,puVar5 + (ulong)(uVar12 * 0xe) + 7,
                           (this->super_VideoBase).base_stream_._M_elems + uVar14,
                           (long)(int)(iVar4 - uVar12),(ulong)uVar16);
                break;
              case DoubleText:
                VideoBase::output_double_text
                          (&this->super_VideoBase,puVar5 + uVar12 * 0xe,
                           (this->super_VideoBase).base_stream_._M_elems + uVar14,
                           (this->super_VideoBase).auxiliary_stream_._M_elems + uVar14,
                           (long)(int)(iVar4 - uVar12),(ulong)uVar16);
                break;
              case HighRes:
                VideoBase::output_high_resolution
                          (&this->super_VideoBase,puVar5 + (ulong)(uVar12 * 0xe) + 7,
                           (this->super_VideoBase).base_stream_._M_elems + uVar14,
                           (long)(int)(iVar4 - uVar12));
                break;
              case DoubleHighRes:
                VideoBase::output_double_high_resolution
                          (&this->super_VideoBase,puVar5 + uVar12 * 0xe,
                           (this->super_VideoBase).base_stream_._M_elems + uVar14,
                           (this->super_VideoBase).auxiliary_stream_._M_elems + uVar14,
                           (long)(int)(iVar4 - uVar12));
                break;
              case LowRes:
                VideoBase::output_low_resolution
                          (&this->super_VideoBase,puVar5 + (ulong)(uVar12 * 0xe) + 7,
                           (this->super_VideoBase).base_stream_._M_elems + uVar14,
                           (long)(int)(iVar4 - uVar12),uVar12,uVar16);
                break;
              case DoubleLowRes:
                VideoBase::output_double_low_resolution
                          (&this->super_VideoBase,puVar5 + uVar12 * 0xe,
                           (this->super_VideoBase).base_stream_._M_elems + uVar14,
                           (this->super_VideoBase).auxiliary_stream_._M_elems + uVar14,
                           (long)(int)(iVar4 - uVar12),uVar12,uVar16);
                break;
              case FatLowRes:
                VideoBase::output_fat_low_resolution
                          (&this->super_VideoBase,puVar5 + (ulong)(uVar12 * 0xe) + 7,
                           (this->super_VideoBase).base_stream_._M_elems + uVar14,
                           (long)(int)(iVar4 - uVar12),uVar12,uVar16);
              }
            }
          }
          if (0x27 < iVar1) {
            puVar5 = (this->super_VideoBase).pixel_pointer_;
            if (puVar5 != (uint8_t *)0x0) {
              if ((this->super_VideoBase).was_double_ == true) {
                puVar5[0x237] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x236] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x235] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x234] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x233] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x232] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x231] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x230] = '\0';
              }
              else if ((GVar3 == HighRes) &&
                      ((char)(this->super_VideoBase).base_stream_._M_elems[0x27] < '\0')) {
                puVar5[0x237] = (this->super_VideoBase).graphics_carry_;
              }
              else {
                puVar5[0x237] = '\0';
              }
            }
            Outputs::CRT::CRT::output_data(this_00,0x238,0x238);
            (this->super_VideoBase).pixel_pointer_ = (uint8_t *)0x0;
          }
        }
      }
      else if (((int)uVar12 < 0x28) && (0x27 < iVar1)) {
        Outputs::CRT::CRT::output_blank(this_00,0x238);
      }
      iVar4 = (this->super_VideoBase).column_;
      if ((iVar4 < 0x31) && (0x30 < iVar1)) {
        Outputs::CRT::CRT::output_blank(this_00,0x76);
        iVar4 = (this->super_VideoBase).column_;
      }
      if ((iVar4 < 0x35) && (0x34 < iVar1)) {
        Outputs::CRT::CRT::output_sync(this_00,0x38);
      }
      GVar3 = VideoSwitches<Cycles>::graphics_mode((VideoSwitches<Cycles> *)this,0);
      iVar4 = (this->super_VideoBase).column_;
      if ((int)GVar3 < 2) {
        bVar9 = SBORROW4(iVar4,0x36);
        iVar7 = iVar4 + -0x36;
        iVar8 = 0x35;
      }
      else {
        iVar7 = 0x36;
        if (0x36 < iVar4) {
          iVar7 = iVar4;
        }
        iVar8 = 0x39;
        if (iVar1 < 0x39) {
          iVar8 = iVar1;
        }
        if (iVar8 - iVar7 != 0 && iVar7 <= iVar8) {
          Outputs::CRT::CRT::output_colour_burst(this_00,(iVar8 - iVar7) * 0xe,0xc0,false,')');
          iVar4 = (this->super_VideoBase).column_;
        }
        bVar9 = SBORROW4(iVar4,0x39);
        iVar7 = iVar4 + -0x39;
        iVar8 = 0x38;
      }
      if (bVar9 != iVar7 < 0) {
        iVar4 = iVar8;
      }
      if (iVar1 - iVar4 != 0 && iVar4 <= iVar1) {
        Outputs::CRT::CRT::output_blank(this_00,(iVar1 - iVar4) * 0xe);
      }
    }
    cycles.super_WrappedInt<Cycles>.length_ = (WrappedInt<Cycles>)(ulong)(uint)(iVar10 - iVar15);
    iVar10 = (iVar15 + (this->super_VideoBase).column_) % 0x41;
    (this->super_VideoBase).column_ = iVar10;
    if (iVar10 == 0) {
      (this->super_VideoBase).row_ = ((this->super_VideoBase).row_ + 1) % 0x106;
      VideoSwitches<Cycles>::did_end_line((VideoSwitches<Cycles> *)this);
      if (uVar6 < 3) {
        Outputs::CRT::CRT::output_sync(this_00,2);
      }
      else {
        Outputs::CRT::CRT::output_blank(this_00,2);
      }
    }
  } while( true );
}

Assistant:

void advance(Cycles cycles) {
			/*
				Addressing scheme used throughout is that column 0 is the first column with pixels in it;
				row 0 is the first row with pixels in it.

				A frame is oriented around 65 cycles across, 262 lines down.
			*/
			constexpr int first_sync_line = 220;	// A complete guess. Information needed.
			constexpr int first_sync_column = 49;	// Also a guess.
			constexpr int sync_length = 4;			// One of the two likely candidates.

			int int_cycles = int(cycles.as_integral());
			while(int_cycles) {
				const int cycles_this_line = std::min(65 - column_, int_cycles);
				const int ending_column = column_ + cycles_this_line;
				const bool is_vertical_sync_line = (row_ >= first_sync_line && row_ < first_sync_line + 3);

				if(is_vertical_sync_line) {
					// In effect apply an XOR to HSYNC and VSYNC flags in order to include equalising
					// pulses (and hence keep hsync approximately where it should be during vsync).
					const int blank_start = std::max(first_sync_column - sync_length, column_);
					const int blank_end = std::min(first_sync_column, ending_column);
					if(blank_end > blank_start) {
						if(blank_start > column_) {
							crt_.output_sync((blank_start - column_) * 14);
						}
						crt_.output_blank((blank_end - blank_start) * 14);
						if(blank_end < ending_column) {
							crt_.output_sync((ending_column - blank_end) * 14);
						}
					} else {
						crt_.output_sync(cycles_this_line * 14);
					}
				} else {
					const GraphicsMode line_mode = graphics_mode(row_);

					// Determine whether there's any fetching to do. Fetching occurs during the first
					// 40 columns of rows prior to 192.
					if(row_ < 192 && column_ < 40) {
						const int character_row = row_ >> 3;
						const uint16_t row_address = uint16_t((character_row >> 3) * 40 + ((character_row&7) << 7));

						// Grab the memory contents that'll be needed momentarily.
						const int fetch_end = std::min(40, ending_column);
						uint16_t fetch_address;
						switch(line_mode) {
							default:
							case GraphicsMode::Text:
							case GraphicsMode::DoubleText:
							case GraphicsMode::LowRes:
							case GraphicsMode::FatLowRes:
							case GraphicsMode::DoubleLowRes: {
								const uint16_t text_address = uint16_t(((video_page()+1) * 0x400) + row_address);
								fetch_address = uint16_t(text_address + column_);
							} break;

							case GraphicsMode::HighRes:
							case GraphicsMode::DoubleHighRes:
								fetch_address = uint16_t(((video_page()+1) * 0x2000) + row_address + ((row_&7) << 10) + column_);
							break;
						}

						bus_handler_.perform_read(
							fetch_address,
							size_t(fetch_end - column_),
							&base_stream_[size_t(column_)],
							&auxiliary_stream_[size_t(column_)]);
					}

					if(row_ < 192) {
						// The pixel area is the first 40.5 columns; base contents
						// remain where they would naturally be but auxiliary
						// graphics appear to the left of that.
						if(!column_) {
							pixel_pointer_ = crt_.begin_data(568);
							graphics_carry_ = 0;
							was_double_ = true;
						}

						if(column_ < 40) {
							const int pixel_start = std::max(0, column_);
							const int pixel_end = std::min(40, ending_column);
							const int pixel_row = row_ & 7;

							const bool is_double = is_double_mode(line_mode);
							if(!is_double && was_double_ && pixel_pointer_) {
								pixel_pointer_[pixel_start*14 + 0] =
								pixel_pointer_[pixel_start*14 + 1] =
								pixel_pointer_[pixel_start*14 + 2] =
								pixel_pointer_[pixel_start*14 + 3] =
								pixel_pointer_[pixel_start*14 + 4] =
								pixel_pointer_[pixel_start*14 + 5] =
								pixel_pointer_[pixel_start*14 + 6] = 0;
							}
							was_double_ = is_double;

							if(pixel_pointer_) {
								switch(line_mode) {
									case GraphicsMode::Text:
										output_text(
											&pixel_pointer_[pixel_start * 14 + 7],
											&base_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start),
											size_t(pixel_row));
									break;

									case GraphicsMode::DoubleText:
										output_double_text(
											&pixel_pointer_[pixel_start * 14],
											&base_stream_[size_t(pixel_start)],
											&auxiliary_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start),
											size_t(pixel_row));
									break;

									case GraphicsMode::LowRes:
										output_low_resolution(
											&pixel_pointer_[pixel_start * 14 + 7],
											&base_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start),
											pixel_start,
											pixel_row);
									break;

									case GraphicsMode::FatLowRes:
										output_fat_low_resolution(
											&pixel_pointer_[pixel_start * 14 + 7],
											&base_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start),
											pixel_start,
											pixel_row);
									break;

									case GraphicsMode::DoubleLowRes:
										output_double_low_resolution(
											&pixel_pointer_[pixel_start * 14],
											&base_stream_[size_t(pixel_start)],
											&auxiliary_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start),
											pixel_start,
											pixel_row);
									break;

									case GraphicsMode::HighRes:
										output_high_resolution(
											&pixel_pointer_[pixel_start * 14 + 7],
											&base_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start));
									break;

									case GraphicsMode::DoubleHighRes:
										output_double_high_resolution(
											&pixel_pointer_[pixel_start * 14],
											&base_stream_[size_t(pixel_start)],
											&auxiliary_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start));
									break;

									default: break;
								}
							}

							if(pixel_end == 40) {
								if(pixel_pointer_) {
									if(was_double_) {
										pixel_pointer_[560] = pixel_pointer_[561] = pixel_pointer_[562] = pixel_pointer_[563] =
										pixel_pointer_[564] = pixel_pointer_[565] = pixel_pointer_[566] = pixel_pointer_[567] = 0;
									} else {
										if(line_mode == GraphicsMode::HighRes && base_stream_[39]&0x80)
											pixel_pointer_[567] = graphics_carry_;
										else
											pixel_pointer_[567] = 0;
									}
								}

								crt_.output_data(568, 568);
								pixel_pointer_ = nullptr;
							}
						}
					} else {
						if(column_ < 40 && ending_column >= 40) {
							crt_.output_blank(568);
						}
					}

					/*
						The left border, sync, right border pattern doesn't depend on whether
						there were pixels this row and is output as soon as it is known.
					*/

					if(column_ < first_sync_column && ending_column >= first_sync_column) {
						crt_.output_blank(first_sync_column*14 - 568);
					}

					if(column_ < (first_sync_column + sync_length) && ending_column >= (first_sync_column + sync_length)) {
						crt_.output_sync(sync_length*14);
					}

					int second_blank_start;
					// Colour burst is present on all lines of the display if graphics mode is enabled on the top
					// portion; therefore use the graphics mode on line 0 rather than the current line, to avoid
					// disabling it in mixed modes.
					if(!is_text_mode(graphics_mode(0))) {
						const int colour_burst_start = std::max(first_sync_column + sync_length + 1, column_);
						const int colour_burst_end = std::min(first_sync_column + sync_length + 4, ending_column);
						if(colour_burst_end > colour_burst_start) {
							// UGLY HACK AHOY!
							// The OpenGL scan target introduces a phase error of 1/8th of a wave. The Metal one does not.
							// Supply the real phase value if this is an Apple build.
							// TODO: eliminate UGLY HACK.
#if defined(__APPLE__) && !defined(IGNORE_APPLE)
							constexpr uint8_t phase = 224;
#else
							constexpr uint8_t phase = 192;
#endif

							crt_.output_colour_burst((colour_burst_end - colour_burst_start) * 14, phase);
						}

						second_blank_start = std::max(first_sync_column + sync_length + 3, column_);
					} else {
						second_blank_start = std::max(first_sync_column + sync_length, column_);
					}

					if(ending_column > second_blank_start) {
						crt_.output_blank((ending_column - second_blank_start) * 14);
					}
				}

				int_cycles -= cycles_this_line;
				column_ = (column_ + cycles_this_line) % 65;
				if(!column_) {
					row_ = (row_ + 1) % 262;
					did_end_line();

					// Add an extra half a colour cycle of blank; this isn't counted in the run_for
					// count explicitly but is promised. If this is a vertical sync line, output sync
					// instead of blank, taking that to be the default level.
					if(is_vertical_sync_line) {
						crt_.output_sync(2);
					} else {
						crt_.output_blank(2);
					}
				}
			}
		}